

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O0

bool __thiscall
QGenericItemModel::moveColumns
          (QGenericItemModel *this,QModelIndex *sourceParent,int sourceColumn,int count,
          QModelIndex *destinationParent,int destinationColumn)

{
  bool bVar1;
  Op in_EDX;
  int *in_RSI;
  int *in_RDI;
  QModelIndex *in_R8;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  int *in_stack_00000040;
  undefined4 in_stack_ffffffffffffffe8;
  QGenericItemModelImplBase *this_00;
  
  this_00 = *(QGenericItemModelImplBase **)(in_FS_OFFSET + 0x28);
  std::unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter>::operator->
            ((unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter> *)0x84fc00);
  bVar1 = QGenericItemModelImplBase::call<bool,QModelIndex,int,int,QModelIndex,int>
                    (this_00,in_EDX,(QModelIndex *)CONCAT44(in_R9D,in_stack_ffffffffffffffe8),in_RDI
                     ,in_RSI,in_R8,in_stack_00000040);
  if (*(QGenericItemModelImplBase **)(in_FS_OFFSET + 0x28) == this_00) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QGenericItemModel::moveColumns(const QModelIndex &sourceParent, int sourceColumn, int count,
                                    const QModelIndex &destinationParent, int destinationColumn)
{
    return impl->call<bool>(QGenericItemModelImplBase::MoveColumns,
                            sourceParent, sourceColumn, count,
                            destinationParent, destinationColumn);
}